

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_Variant *
convertToMatchingValue
          (UA_Server *server,UA_Variant *value,UA_NodeId *targetDataTypeId,UA_Variant *editableValue
          )

{
  size_t *psVar1;
  UA_Boolean UVar2;
  type_equivalence tVar3;
  type_equivalence tVar4;
  UA_DataType *t;
  type_equivalence te2;
  type_equivalence te1;
  UA_ByteString *str;
  UA_DataType *targetDataType;
  UA_Variant *editableValue_local;
  UA_NodeId *targetDataTypeId_local;
  UA_Variant *value_local;
  UA_Server *server_local;
  
  t = UA_findDataType(targetDataTypeId);
  if (t == (UA_DataType *)0x0) {
    server_local = (UA_Server *)0x0;
  }
  else {
    server_local = (UA_Server *)editableValue;
    if (((t == UA_TYPES + 2) && (value->type == (UA_DataType *)0x160620)) &&
       (UVar2 = UA_Variant_isScalar(value), UVar2)) {
      psVar1 = (size_t *)value->data;
      editableValue->storageType = UA_VARIANT_DATA_NODELETE;
      editableValue->type = (UA_DataType *)0x1603e0;
      editableValue->arrayLength = *psVar1;
      editableValue->data = (void *)psVar1[1];
    }
    else {
      tVar3 = typeEquivalence(t);
      tVar4 = typeEquivalence(value->type);
      if ((tVar3 == TYPE_EQUIVALENCE_NONE) || (tVar3 != tVar4)) {
        server_local = (UA_Server *)0x0;
      }
      else {
        memcpy(editableValue,value,0x30);
        editableValue->storageType = UA_VARIANT_DATA_NODELETE;
        editableValue->type = t;
      }
    }
  }
  return (UA_Variant *)server_local;
}

Assistant:

static const UA_Variant *
convertToMatchingValue(UA_Server *server, const UA_Variant *value,
                       const UA_NodeId *targetDataTypeId, UA_Variant *editableValue) {
    const UA_DataType *targetDataType = UA_findDataType(targetDataTypeId);
    if(!targetDataType)
        return NULL;

    /* A string is written to a byte array. the valuerank and array
       dimensions are checked later */
    if(targetDataType == &UA_TYPES[UA_TYPES_BYTE] &&
       value->type == &UA_TYPES[UA_TYPES_BYTESTRING] &&
       UA_Variant_isScalar(value)) {
        UA_ByteString *str = (UA_ByteString*)value->data;
        editableValue->storageType = UA_VARIANT_DATA_NODELETE;
        editableValue->type = &UA_TYPES[UA_TYPES_BYTE];
        editableValue->arrayLength = str->length;
        editableValue->data = str->data;
        return editableValue;
    }

    /* An enum was sent as an int32, or an opaque type as a bytestring. This
     * is detected with the typeIndex indicating the "true" datatype. */
    enum type_equivalence te1 = typeEquivalence(targetDataType);
    enum type_equivalence te2 = typeEquivalence(value->type);
    if(te1 != TYPE_EQUIVALENCE_NONE && te1 == te2) {
        *editableValue = *value;
        editableValue->storageType = UA_VARIANT_DATA_NODELETE;
        editableValue->type = targetDataType;
        return editableValue;
    }

    /* No more possible equivalencies */
    return NULL;
}